

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.cpp
# Opt level: O2

void __thiscall cppnet::Dispatcher::DoTask(Dispatcher *this)

{
  long lVar1;
  size_t i;
  ulong uVar2;
  unique_lock<std::mutex> lock;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> local_38;
  unique_lock<std::mutex> local_20;
  
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::unique_lock<std::mutex>::unique_lock(&local_20,&this->_task_list_mutex);
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (this->_task_list).
       super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (this->_task_list).
       super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->_task_list).
       super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->_task_list).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_task_list).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_task_list).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  lVar1 = 0;
  for (uVar2 = 0;
      uVar2 < (ulong)((long)local_38.
                            super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_38.
                            super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar2 = uVar2 + 1) {
    std::function<void_()>::operator()
              ((function<void_()> *)
               ((long)&((local_38.
                         super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->super__Function_base).
                       _M_functor + lVar1));
    lVar1 = lVar1 + 0x20;
  }
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector(&local_38);
  return;
}

Assistant:

void Dispatcher::DoTask() {
    std::vector<Task> func_vec;
    {
        std::unique_lock<std::mutex> lock(_task_list_mutex);
        func_vec.swap(_task_list);
    }

    for (std::size_t i = 0; i < func_vec.size(); ++i) {
        func_vec[i]();
    }
}